

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelmapped.h
# Opt level: O2

void __thiscall
TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_>::KsiBar
          (TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_> *this,TPZVec<double> *ksi,
          TPZVec<double> *ksibar,TPZFMatrix<double> *jac)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  long row;
  double local_188;
  TPZFNMatrix<2,_double> dphi;
  TPZFNMatrix<2,_double> phi;
  
  dphi.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<2,_double>::TPZFNMatrix(&phi,2,1,(double *)&dphi);
  local_188 = 0.0;
  TPZFNMatrix<2,_double>::TPZFNMatrix(&dphi,1,2,&local_188);
  pztopology::TPZLine::TShape<double>
            (ksi,&phi.super_TPZFMatrix<double>,&dphi.super_TPZFMatrix<double>);
  (*(jac->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (jac,1);
  local_188 = 0.0;
  TPZVec<double>::Fill(ksibar,&local_188,0,-1);
  for (row = 0; row != 2; row = row + 1) {
    pdVar3 = TPZFMatrix<double>::operator()(&phi.super_TPZFMatrix<double>,row,0);
    *ksibar->fStore =
         *pdVar3 * (this->fCornerCo).super_TPZFMatrix<double>.fElem
                   [(this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fRow * row] + *ksibar->fStore;
    pdVar3 = TPZFMatrix<double>::operator()(&dphi.super_TPZFMatrix<double>,0,row);
    dVar1 = *pdVar3;
    dVar2 = (this->fCornerCo).super_TPZFMatrix<double>.fElem
            [(this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
             fRow * row];
    pdVar3 = TPZFMatrix<double>::operator()(jac,0,0);
    *pdVar3 = dVar1 * dVar2 + *pdVar3;
  }
  TPZFNMatrix<2,_double>::~TPZFNMatrix(&dphi);
  TPZFNMatrix<2,_double>::~TPZFNMatrix(&phi);
  return;
}

Assistant:

void KsiBar(TPZVec<REAL> &ksi, TPZVec<REAL> &ksibar, TPZFMatrix<REAL> &jac) const
    {
		const int dim = Geo::Dimension;
		TPZFNMatrix<Geo::NNodes> phi(Geo::NNodes,1,0.);
		TPZFNMatrix<dim*Geo::NNodes> dphi(dim,Geo::NNodes,0.);
		Geo::Shape(ksi,phi,dphi);
		jac.Redim(dim,dim);
		ksibar.Fill(0.);
		int in,id,jd;
		for(in=0; in<Geo::NNodes; in++)
		{
			for(id=0; id<dim; id++)
			{
				ksibar[id] += phi(in,0)*fCornerCo.GetVal(id,in);
				for(jd=0; jd<dim; jd++)
				{
					jac(id,jd) += dphi(jd,in)*fCornerCo.GetVal(id,in);
				}
			}
		}
    }